

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

CustomLayerParams_CustomLayerParamValue *
google::protobuf::Arena::
CreateMessageInternal<CoreML::Specification::CustomLayerParams_CustomLayerParamValue>(Arena *arena)

{
  CustomLayerParams_CustomLayerParamValue *pCVar1;
  
  if (arena != (Arena *)0x0) {
    pCVar1 = DoCreateMessage<CoreML::Specification::CustomLayerParams_CustomLayerParamValue>(arena);
    return pCVar1;
  }
  pCVar1 = (CustomLayerParams_CustomLayerParamValue *)operator_new(0x20);
  CoreML::Specification::CustomLayerParams_CustomLayerParamValue::
  CustomLayerParams_CustomLayerParamValue(pCVar1,(Arena *)0x0,false);
  return pCVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }